

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::FloatingPointLE<float>(char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *pAVar3;
  AssertionResult *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  stringstream *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  AssertionResult AVar5;
  stringstream val2_ss;
  stringstream val1_ss;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  FloatingPoint<float> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  AssertionResult *in_stack_fffffffffffffbf0;
  char (*in_stack_fffffffffffffc08) [7];
  AssertionResult *in_stack_fffffffffffffc10;
  stringstream *ss;
  string local_3a8 [32];
  string local_388 [52];
  int local_354;
  stringstream local_350 [16];
  ostream local_340 [396];
  int local_1b4;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  FloatingPoint<float> local_28;
  FloatingPoint<float> local_24;
  float local_20;
  float local_1c [7];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  
  if (in_XMM1_Da <= in_XMM0_Da) {
    ss = in_RDI;
    local_20 = in_XMM1_Da;
    local_1c[0] = in_XMM0_Da;
    FloatingPoint<float>::FloatingPoint(&local_24,local_1c);
    FloatingPoint<float>::FloatingPoint(&local_28,&local_20);
    bVar1 = FloatingPoint<float>::AlmostEquals
                      ((FloatingPoint<float> *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    if (bVar1) {
      AVar5 = AssertionSuccess();
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar5.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b0);
      local_1b4 = (int)std::setprecision(8);
      poVar2 = std::operator<<(local_1a0,(_Setprecision)local_1b4);
      std::ostream::operator<<(poVar2,local_1c[0]);
      std::__cxx11::stringstream::stringstream(local_350);
      local_354 = (int)std::setprecision(8);
      poVar2 = std::operator<<(local_340,(_Setprecision)local_354);
      std::ostream::operator<<(poVar2,local_20);
      AssertionFailure();
      this = AssertionResult::operator<<
                       (in_stack_fffffffffffffbf0,(char (*) [12])in_stack_fffffffffffffbe8);
      other = AssertionResult::operator<<
                        (in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8);
      pAVar3 = AssertionResult::operator<<(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      value = AssertionResult::operator<<
                        (in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8);
      AssertionResult::operator<<(in_stack_fffffffffffffbf0,(char (*) [3])in_stack_fffffffffffffbe8)
      ;
      AssertionResult::operator<<(pAVar3,&value->success_);
      StringStreamToString(ss);
      pAVar3 = AssertionResult::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      value_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 AssertionResult::operator<<(pAVar3,(char (*) [5])in_stack_fffffffffffffbe8);
      StringStreamToString(ss);
      AssertionResult::operator<<(pAVar3,value_00);
      AssertionResult::AssertionResult(this,other);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string(local_388);
      AssertionResult::~AssertionResult((AssertionResult *)0x156f9e);
      std::__cxx11::stringstream::~stringstream(local_350);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  else {
    AVar5 = AssertionSuccess();
    _Var4._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar5.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var4._M_head_impl;
  AVar5._0_8_ = in_RDI;
  return AVar5;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1, const char* expr2,
                                RawType val1, RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
         << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
         << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
         << StringStreamToString(&val2_ss);
}